

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_estimateCStreamSize(int compressionLevel)

{
  size_t sVar1;
  int compressionLevel_00;
  ulong uVar2;
  ZSTD_compressionParameters local_d8;
  ZSTD_CCtx_params cctxParams;
  
  compressionLevel_00 = 1;
  if (compressionLevel < 1) {
    compressionLevel_00 = compressionLevel;
  }
  uVar2 = 0;
  for (; compressionLevel_00 <= compressionLevel; compressionLevel_00 = compressionLevel_00 + 1) {
    ZSTD_getCParams(&local_d8,compressionLevel_00,0,0);
    cctxParams.customMem.customFree = (ZSTD_freeFunction)0x0;
    cctxParams.customMem.opaque = (void *)0x0;
    cctxParams.ldmParams.hashRateLog = 0;
    cctxParams.ldmParams.windowLog = 0;
    cctxParams.customMem.customAlloc = (ZSTD_allocFunction)0x0;
    cctxParams.ldmParams.enableLdm = 0;
    cctxParams.ldmParams.hashLog = 0;
    cctxParams.ldmParams.bucketSizeLog = 0;
    cctxParams.ldmParams.minMatchLength = 0;
    cctxParams.jobSize = 0;
    cctxParams.overlapLog = 0;
    cctxParams.rsyncable = 0;
    cctxParams.forceWindow = 0;
    cctxParams.attachDictPref = ZSTD_dictDefaultAttach;
    cctxParams.nbWorkers = 0;
    cctxParams._60_4_ = 0;
    cctxParams.format = ZSTD_f_zstd1;
    cctxParams.cParams.targetLength = local_d8.targetLength;
    cctxParams.cParams.strategy = local_d8.strategy;
    cctxParams.cParams.windowLog = local_d8.windowLog;
    cctxParams.cParams.chainLog = local_d8.chainLog;
    cctxParams.fParams.noDictIDFlag = 0;
    cctxParams.compressionLevel = 3;
    cctxParams.fParams.contentSizeFlag = 1;
    cctxParams.fParams.checksumFlag = 0;
    sVar1 = ZSTD_estimateCStreamSize_usingCCtxParams(&cctxParams);
    if (uVar2 < sVar1) {
      uVar2 = sVar1;
    }
  }
  return uVar2;
}

Assistant:

size_t ZSTD_estimateCStreamSize(int compressionLevel)
{
    int level;
    size_t memBudget = 0;
    for (level=MIN(compressionLevel, 1); level<=compressionLevel; level++) {
        size_t const newMB = ZSTD_estimateCStreamSize_internal(level);
        if (newMB > memBudget) memBudget = newMB;
    }
    return memBudget;
}